

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashSet.hpp
# Opt level: O2

Iterator __thiscall HashSet<String>::find(HashSet<String> *this,String *key)

{
  Item *this_00;
  bool bVar1;
  usize uVar2;
  Item **ppIVar3;
  
  if (this->data != (Item **)0x0) {
    uVar2 = hash(key);
    ppIVar3 = this->data + uVar2 % this->capacity;
    while (this_00 = *ppIVar3, this_00 != (Item *)0x0) {
      bVar1 = String::operator==(&this_00->key,key);
      if (bVar1) {
        return (Iterator)this_00;
      }
      ppIVar3 = &this_00->nextCell;
    }
  }
  return (Iterator)(this->_end).item;
}

Assistant:

Iterator find(const T& key) const
  {
    if(!data) return _end;
    usize hashCode = hash(key);
    Item* item = data[hashCode % capacity];
    while(item)
    {
      if(item->key == key) return item;
      item = item->nextCell;
    }
    return _end;
  }